

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O0

void getcolormap(nn_quant *nnq,uchar *map)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  uchar *map_local;
  nn_quant *nnq_local;
  
  _j = map;
  for (local_20 = 0; local_20 < nnq->netsize; local_20 = local_20 + 1) {
    for (local_1c = 3; -1 < local_1c; local_1c = local_1c + -1) {
      *_j = (uchar)nnq->network[local_20][local_1c];
      _j = _j + 1;
    }
  }
  return;
}

Assistant:

void getcolormap(nnq, map)
nn_quant *nnq;
unsigned char *map;
{
	int i,j;
	for(j=0; j < nnq->netsize; j++) {
		for (i=3; i>=0; i--) {
			*map = nnq->network[j][i];
			map++;
		}
	}
}